

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# explode.c
# Opt level: O2

void explode(float x,float y,int big)

{
  EXPLOSION *pEVar1;
  
  pEVar1 = (EXPLOSION *)malloc(0x18);
  pEVar1->x = x;
  pEVar1->y = y;
  pEVar1->big = big;
  pEVar1->time = 0.0;
  pEVar1->next = explosions;
  explosions = pEVar1;
  return;
}

Assistant:

void explode(float x, float y, int big)
{
   EXPLOSION *e = malloc(sizeof(EXPLOSION));

   e->x = x;
   e->y = y;

   e->big = big;

   e->time = 0;

   e->next = explosions;
   explosions = e;
}